

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write_bytes<char,std::back_insert_iterator<std::__cxx11::string>>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,string_view bytes,basic_format_specs<char> *specs)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  size_t in_RDX;
  anon_class_16_1_a7b7af8b *in_RSI;
  basic_format_specs<char> *in_RDI;
  basic_string_view<char> local_20 [2];
  
  local_20[0].data_ = (char *)in_RSI;
  local_20[0].size_ = in_RDX;
  basic_string_view<char>::size(local_20);
  bVar1 = write_padded<(fmt::v7::align::type)1,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_bytes<char,std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&)::_lambda(char*)_1_>
                    (in_RCX,in_RDI,local_20[0].size_,(anon_class_16_1_a7b7af8b *)local_20[0].data_);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )bVar1.container;
}

Assistant:

OutputIt write_bytes(OutputIt out, string_view bytes,
                     const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, bytes.size(), [bytes](iterator it) {
    const char* data = bytes.data();
    return copy_str<Char>(data, data + bytes.size(), it);
  });
}